

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O1

void nvrm_mmap(uint32_t id,uint32_t fd,uint64_t mmap_addr,uint64_t len,uint64_t mmap_offset)

{
  uint uVar1;
  mmt_fd_type mVar2;
  gpu_object *pgVar3;
  cpu_mapping *mapping;
  
  pgVar3 = gpu_objects;
  do {
    if (pgVar3 == (gpu_object *)0x0) {
      if (dump_sys_mmap != 0) {
        fputc(10,_stdout);
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
      }
      mVar2 = demmt_get_fdtype(fd);
      if (mVar2 == FDNVIDIA) {
        fprintf(_stdout,"ERROR: nvrm_mmap: couldn\'t find object/space offset: 0x%016lx\n",
                mmap_offset);
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
      }
      buffer_mmap(id,fd,mmap_addr,len,mmap_offset);
      return;
    }
    for (mapping = pgVar3->cpu_mappings; mapping != (cpu_mapping *)0x0; mapping = mapping->next) {
      if (mapping->mmap_offset == mmap_offset) {
        mapping->cpu_addr = mmap_addr;
        uVar1 = mapping->id;
        mapping->id = id;
        set_cpu_mapping(id,mapping);
        if (dump_sys_mmap != 0) {
          if (mapping->fdtype == FDNVIDIA) {
            fprintf(_stdout,", cid: 0x%08x, handle: 0x%08x",(ulong)pgVar3->cid,(ulong)pgVar3->handle
                   );
            describe_nvrm_object(pgVar3->cid,pgVar3->handle,"");
          }
          fputc(10,_stdout);
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        if (uVar1 != 0) {
          fprintf(_stdout,"ERROR: %d -> %d, mapping reuse, expect crash soon\n",(ulong)uVar1,id);
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        if (mapping->mmap_offset == 0) {
          mapping->mmap_offset = 0xffffffffffffffff;
        }
        return;
      }
    }
    pgVar3 = pgVar3->next;
  } while( true );
}

Assistant:

void nvrm_mmap(uint32_t id, uint32_t fd, uint64_t mmap_addr, uint64_t len, uint64_t mmap_offset)
{
	struct gpu_object *obj;
	struct cpu_mapping *cpu_mapping;
	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		for (cpu_mapping = obj->cpu_mappings; cpu_mapping != NULL; cpu_mapping = cpu_mapping->next)
			//can't validate fd
			if (cpu_mapping->mmap_offset == mmap_offset)
			{
				cpu_mapping->cpu_addr = mmap_addr;
				uint32_t old_id = cpu_mapping->id;
				cpu_mapping->id = id;
				set_cpu_mapping(id, cpu_mapping);

				if (dump_sys_mmap)
				{
					if (cpu_mapping->fdtype == FDNVIDIA)
					{
						mmt_log_cont(", cid: 0x%08x, handle: 0x%08x", obj->cid, obj->handle);
						describe_nvrm_object(obj->cid, obj->handle, "");
					}
					mmt_log_cont_nl();
				}
				if (old_id)
					mmt_error("%d -> %d, mapping reuse, expect crash soon\n", old_id, id);
				/*
				 * On newer blob, where mmap_offset is 0 for
				 * all mappings (WTF?), clobber the value to
				 * prevent the next nvrm_mmap from finding this
				 * mapping.
				 */
				if (cpu_mapping->mmap_offset == 0)
					cpu_mapping->mmap_offset = -1;
				return;
			}
	if (dump_sys_mmap)
		mmt_log_cont_nl();

	if (demmt_get_fdtype(fd) == FDNVIDIA)
		mmt_error("nvrm_mmap: couldn't find object/space offset: 0x%016" PRIx64 "\n", mmap_offset);

	buffer_mmap(id, fd, mmap_addr, len, mmap_offset);
}